

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O1

void __thiscall Imf_3_4::RgbaInputFile::FromYca::readYCAScanLine(FromYca *this,int y,Rgba *buf)

{
  int iVar1;
  Rgba *pRVar2;
  int i;
  uint scanLine;
  long lVar3;
  
  scanLine = this->_yMax - 1;
  if (y <= this->_yMax) {
    scanLine = y;
  }
  if (y < this->_yMin) {
    scanLine = this->_yMin;
  }
  InputPart::readPixels(this->_inputPart,scanLine);
  if ((this->_readC == false) && (iVar1 = this->_width, 0 < (long)iVar1)) {
    pRVar2 = this->_tmpBuf;
    lVar3 = 0;
    do {
      pRVar2[lVar3 + 0xd].r._h = 0;
      pRVar2[lVar3 + 0xd].b._h = 0;
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  if ((scanLine & 1) == 0) {
    lVar3 = 0;
    do {
      this->_tmpBuf[lVar3] = this->_tmpBuf[0xd];
      this->_tmpBuf[(int)lVar3 + 0xd + this->_width] = this->_tmpBuf[(long)this->_width + 0xb];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xd);
    RgbaYca::reconstructChromaHoriz(this->_width,this->_tmpBuf,buf);
    return;
  }
  memcpy(buf,this->_tmpBuf + 0xd,(long)this->_width << 3);
  return;
}

Assistant:

void
RgbaInputFile::FromYca::readYCAScanLine (int y, Rgba* buf)
{
    //
    // Clamp y.
    //

    if (y < _yMin)
        y = _yMin;
    else if (y > _yMax)
        y = _yMax - 1;

    //
    // Read scan line y into _tmpBuf.
    //

    _inputPart.readPixels (y);

    //
    // Reconstruct missing chroma samples and copy
    // the scan line into buf.
    //

    if (!_readC)
    {
        for (int i = 0; i < _width; ++i)
        {
            _tmpBuf[i + N2].r = 0;
            _tmpBuf[i + N2].b = 0;
        }
    }

    if (y & 1) { memcpy (buf, _tmpBuf + N2, _width * sizeof (Rgba)); }
    else
    {
        padTmpBuf ();
        reconstructChromaHoriz (_width, _tmpBuf, buf);
    }
}